

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O3

exr_result_t
exr_decoding_choose_default_routines
          (exr_const_context_t ctxt,int part_index,exr_decode_pipeline_t *decode)

{
  short sVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  uint uVar5;
  exr_result_t eVar6;
  uint uVar7;
  uint uVar8;
  code *UNRECOVERED_JUMPTABLE_00;
  ulong uVar9;
  internal_exr_unpack_fn p_Var10;
  uint sameoutinc;
  uint8_t *puVar11;
  uint8_t *puVar12;
  char *pcVar13;
  undefined8 uVar14;
  anon_union_8_2_47425d48_for_exr_coding_channel_info_t_12 *paVar15;
  uint uVar16;
  uint samebpc;
  uint sameoutbpc;
  uint sameouttype;
  uint uVar17;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  int simplineoff;
  uint chanstofill;
  uint sametype;
  int iVar21;
  int chanstounpack;
  long lVar22;
  uint uVar23;
  int hastypechange;
  bool bVar24;
  uint local_8c;
  int local_58;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      eVar6 = (**(code **)(ctxt + 0x48))
                        (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
      return eVar6;
    }
    if (decode != (exr_decode_pipeline_t *)0x0) {
      if ((decode->context != ctxt) || (decode->part_index != part_index)) {
        eVar6 = (**(code **)(ctxt + 0x48))
                          (ctxt,3,
                           "Cross-wired request for default routines from different context / part",
                           *(code **)(ctxt + 0x48));
        return eVar6;
      }
      lVar4 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      uVar7 = *(uint *)(lVar4 + 4) & 0xfffffffe;
      uVar8 = (uint)decode->channel_count;
      if (decode->channel_count < 1) {
        chanstofill = 0;
        sametype = 0xfffffffe;
        chanstounpack = 0;
        sameouttype = 0xfffffffe;
        samebpc = 0;
        sameoutbpc = 0;
        local_58 = 0;
        hastypechange = 0;
        uVar23 = 0;
        local_8c = 0;
        simplineoff = 0;
        sameoutinc = 0;
      }
      else {
        paVar15 = &decode->channels->field_12;
        sameouttype = 0xfffffffe;
        uVar9 = 0;
        puVar11 = (uint8_t *)0x0;
        sameoutinc = 0;
        simplineoff = 0;
        local_8c = 0;
        uVar23 = 0;
        hastypechange = 0;
        local_58 = 0;
        sameoutbpc = 0;
        samebpc = 0;
        sametype = 0xfffffffe;
        chanstounpack = 0;
        chanstofill = 0;
        do {
          uVar19 = sameoutinc;
          if ((*(int *)(paVar15 + -4) != 0) &&
             (puVar12 = paVar15->decode_to_ptr, puVar12 != (uint8_t *)0x0)) {
            sVar1 = *(int16_t *)((long)paVar15 + -0xc);
            uVar19 = (uint)sVar1;
            if ((sVar1 != 2) && (sVar1 != 4)) {
              UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x48);
              pcVar18 = ((exr_coding_channel_info_t *)(paVar15 + -5))->channel_name;
              pcVar13 = "Invalid / unsupported output bytes per element (%d) for channel %c (%s)";
LAB_00123cce:
              eVar6 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,3,pcVar13,uVar19,uVar9 & 0xffffffff,pcVar18);
              return eVar6;
            }
            uVar2 = *(uint16_t *)((long)paVar15 + -10);
            if (2 < uVar2) {
              UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x48);
              pcVar18 = ((exr_coding_channel_info_t *)(paVar15 + -5))->channel_name;
              pcVar13 = "Invalid / unsupported output data type (%d) for channel %c (%s)";
              uVar19 = (uint)uVar2;
              goto LAB_00123cce;
            }
            uVar3 = *(uint16_t *)((long)paVar15 + -0xe);
            uVar16 = 0xffffffff;
            if (sametype == uVar3) {
              uVar16 = sametype;
            }
            bVar24 = sametype == 0xfffffffe;
            sametype = uVar16;
            if (bVar24) {
              sametype = (uint)uVar3;
            }
            uVar16 = 0xffffffff;
            if (sameouttype == uVar2) {
              uVar16 = sameouttype;
            }
            bVar24 = sameouttype == 0xfffffffe;
            sameouttype = uVar16;
            if (bVar24) {
              sameouttype = (uint)uVar2;
            }
            uVar17 = (uint)*(int8_t *)((long)paVar15 + -0xf);
            uVar16 = 0xffffffff;
            if (samebpc == uVar17) {
              uVar16 = samebpc;
            }
            bVar24 = samebpc == 0;
            samebpc = uVar16;
            if (bVar24) {
              samebpc = uVar17;
            }
            uVar16 = 0xffffffff;
            if (sameoutbpc == uVar19) {
              uVar16 = sameoutbpc;
            }
            bVar24 = sameoutbpc == 0;
            sameoutbpc = uVar16;
            if (bVar24) {
              sameoutbpc = uVar19;
            }
            if ((*(int *)(paVar15 + -3) != 1) || (*(int32_t *)((long)paVar15 + -0x14) != 1)) {
              local_58 = 1;
            }
            uVar16 = *(uint *)(paVar15 + -1);
            iVar21 = -1;
            if (simplineoff == *(int32_t *)((long)paVar15 + -4)) {
              iVar21 = simplineoff;
            }
            bVar24 = simplineoff == 0;
            simplineoff = iVar21;
            if (bVar24) {
              simplineoff = *(int32_t *)((long)paVar15 + -4);
            }
            uVar20 = uVar16;
            uVar5 = uVar16;
            if (uVar23 != 0) {
              lVar22 = (long)(int)(uVar19 * (int)uVar9);
              uVar20 = uVar23;
              if (puVar12 != puVar11 + lVar22) {
                uVar20 = 0xffffffff;
              }
              if ((int)uVar23 < 1) {
                uVar20 = uVar23;
              }
              uVar23 = local_8c;
              if (puVar12 != puVar11 + -lVar22) {
                uVar23 = 0xffffffff;
              }
              if (0 < (int)local_8c) {
                local_8c = uVar23;
              }
              puVar12 = puVar11;
              uVar5 = local_8c;
              if ((int)(uVar20 & local_8c) < 0) {
                puVar12 = (uint8_t *)0x0;
              }
            }
            local_8c = uVar5;
            uVar23 = uVar20;
            chanstofill = chanstofill + 1;
            chanstounpack = chanstounpack + (uint)(uVar16 != uVar17);
            hastypechange = hastypechange + (uint)(uVar2 != uVar3);
            puVar11 = puVar12;
            uVar19 = uVar16;
            if ((sameoutinc != 0) && (uVar19 = sameoutinc, sameoutinc != uVar16)) {
              uVar19 = 0xffffffff;
            }
          }
          sameoutinc = uVar19;
          uVar9 = uVar9 + 1;
          paVar15 = paVar15 + 6;
        } while (uVar8 != uVar9);
      }
      if (uVar23 != sameoutbpc * uVar8) {
        uVar23 = 0xffffffff;
      }
      uVar19 = 0xffffffff;
      if (local_8c == sameoutbpc * uVar8) {
        uVar19 = local_8c;
      }
      iVar21 = *(int *)(lVar4 + 0xb0);
      if ((((uVar7 != 2) && (iVar21 == 0)) && (chanstounpack == 0)) &&
         (((hastypechange == 0 && (0 < (int)chanstofill)) && (chanstofill == uVar8)))) {
        decode->read_fn = read_uncompressed_direct;
        decode->decompress_fn = (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0;
        decode->unpack_and_convert_fn = (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0;
        return 0;
      }
      decode->read_fn = default_read_chunk;
      if (iVar21 != 0) {
        decode->decompress_fn = default_decompress_chunk;
      }
      p_Var10 = internal_exr_match_decode
                          (decode,(uint)(uVar7 == 2),chanstofill,chanstounpack,sametype,sameouttype,
                           samebpc,sameoutbpc,local_58,hastypechange,sameoutinc,uVar23,uVar19,
                           simplineoff);
      decode->unpack_and_convert_fn = (_func_exr_result_t__exr_decode_pipeline_ptr *)p_Var10;
      if (p_Var10 != (internal_exr_unpack_fn)0x0) {
        return 0;
      }
      eVar6 = (**(code **)(ctxt + 0x40))(ctxt,4,"Unable to choose valid unpack routine");
      return eVar6;
    }
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
    uVar14 = 3;
  }
  else {
    UNRECOVERED_JUMPTABLE_00 = *(code **)(ctxt + 0x38);
    uVar14 = 7;
  }
  eVar6 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,uVar14);
  return eVar6;
}

Assistant:

exr_result_t
exr_decoding_choose_default_routines (
    exr_const_context_t ctxt, int part_index, exr_decode_pipeline_t* decode)
{
    int32_t isdeep = 0, chanstofill = 0, chanstounpack = 0, sametype = -2,
            sameouttype = -2, samebpc = 0, sameoutbpc = 0, hassampling = 0,
            hastypechange = 0, simpinterleave = 0, simpinterleaverev = 0,
            simplineoff = 0, sameoutinc = 0;
    uint8_t* interleaveptr = NULL;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!decode) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    if (decode->context != ctxt || decode->part_index != part_index)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Cross-wired request for default routines from different context / part");

    isdeep = (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
              part->storage_mode == EXR_STORAGE_DEEP_TILED)
                 ? 1
                 : 0;

    for (int c = 0; c < decode->channel_count; ++c)
    {
        exr_coding_channel_info_t* decc = (decode->channels + c);

        if (decc->height == 0 || !decc->decode_to_ptr) continue;

        /*
         * if a user specifies a bad pixel stride / line stride
         * we can't know this realistically, and they may want to
         * use 0 to cause things to collapse for testing purposes
         * so only test the values we know we use for decisions
         */
        if (decc->user_bytes_per_element != 2 &&
            decc->user_bytes_per_element != 4)
            return pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output bytes per element (%d) for channel %c (%s)",
                (int) decc->user_bytes_per_element,
                c,
                decc->channel_name);

        if (decc->user_data_type != (uint16_t) (EXR_PIXEL_HALF) &&
            decc->user_data_type != (uint16_t) (EXR_PIXEL_FLOAT) &&
            decc->user_data_type != (uint16_t) (EXR_PIXEL_UINT))
            return pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output data type (%d) for channel %c (%s)",
                (int) decc->user_data_type,
                c,
                decc->channel_name);

        if (sametype == -2)
            sametype = (int32_t) decc->data_type;
        else if (sametype != (int32_t) decc->data_type)
            sametype = -1;

        if (sameouttype == -2)
            sameouttype = (int32_t) decc->user_data_type;
        else if (sameouttype != (int32_t) decc->user_data_type)
            sameouttype = -1;

        if (samebpc == 0)
            samebpc = decc->bytes_per_element;
        else if (samebpc != decc->bytes_per_element)
            samebpc = -1;

        if (sameoutbpc == 0)
            sameoutbpc = decc->user_bytes_per_element;
        else if (sameoutbpc != decc->user_bytes_per_element)
            sameoutbpc = -1;

        if (decc->x_samples != 1 || decc->y_samples != 1) hassampling = 1;

        ++chanstofill;
        if (decc->user_pixel_stride != decc->bytes_per_element) ++chanstounpack;
        if (decc->user_data_type != decc->data_type) ++hastypechange;

        if (simplineoff == 0)
            simplineoff = decc->user_line_stride;
        else if (simplineoff != decc->user_line_stride)
            simplineoff = -1;

        if (simpinterleave == 0)
        {
            interleaveptr     = decc->decode_to_ptr;
            simpinterleave    = decc->user_pixel_stride;
            simpinterleaverev = decc->user_pixel_stride;
        }
        else
        {
            if (simpinterleave > 0 &&
                decc->decode_to_ptr !=
                    (interleaveptr + c * decc->user_bytes_per_element))
            {
                simpinterleave = -1;
            }
            if (simpinterleaverev > 0 &&
                decc->decode_to_ptr !=
                    (interleaveptr - c * decc->user_bytes_per_element))
            {
                simpinterleaverev = -1;
            }
            if (simpinterleave < 0 && simpinterleaverev < 0)
                interleaveptr = NULL;
        }

        if (sameoutinc == 0)
            sameoutinc = decc->user_pixel_stride;
        else if (sameoutinc != decc->user_pixel_stride)
            sameoutinc = -1;
    }

    if (simpinterleave != sameoutbpc * decode->channel_count)
        simpinterleave = -1;
    if (simpinterleaverev != sameoutbpc * decode->channel_count)
        simpinterleaverev = -1;

    /* special case, uncompressed and reading planar data straight in
     * to all the channels */
    if (!isdeep && part->comp_type == EXR_COMPRESSION_NONE &&
        chanstounpack == 0 && hastypechange == 0 && chanstofill > 0 &&
        chanstofill == decode->channel_count)
    {
        decode->read_fn               = &read_uncompressed_direct;
        decode->decompress_fn         = NULL;
        decode->unpack_and_convert_fn = NULL;
        return EXR_ERR_SUCCESS;
    }
    decode->read_fn = &default_read_chunk;
    if (part->comp_type != EXR_COMPRESSION_NONE)
        decode->decompress_fn = &default_decompress_chunk;

    decode->unpack_and_convert_fn = internal_exr_match_decode (
        decode,
        isdeep,
        chanstofill,
        chanstounpack,
        sametype,
        sameouttype,
        samebpc,
        sameoutbpc,
        hassampling,
        hastypechange,
        sameoutinc,
        simpinterleave,
        simpinterleaverev,
        simplineoff);

    if (!decode->unpack_and_convert_fn)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Unable to choose valid unpack routine");

    return EXR_ERR_SUCCESS;
}